

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O1

QRect __thiscall QFbCursor::getCurrentRect(QFbCursor *this)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  undefined8 uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  QRect QVar8;
  
  auVar7 = QImage::rect();
  uVar3 = *(undefined8 *)(*(long *)(this + 0x48) + 0x18);
  iVar6 = (int)uVar3;
  iVar1 = *(int *)(this + 0x58);
  iVar2 = *(int *)(this + 0x5c);
  uVar5 = (**(code **)(**(long **)(this + 0x18) + 0x68))();
  iVar4 = (int)((ulong)uVar5 >> 0x20) + (int)((ulong)uVar3 >> 0x20);
  QVar8.y1.m_i = (auVar7._4_4_ + iVar2) - iVar4;
  QVar8.x1.m_i = ((auVar7._0_4_ - iVar6) + iVar1) - (int)uVar5;
  QVar8.y2.m_i = (auVar7._12_4_ + iVar2) - iVar4;
  QVar8.x2.m_i = ((auVar7._8_4_ - iVar6) + iVar1) - (int)uVar5;
  return QVar8;
}

Assistant:

QRect QFbCursor::getCurrentRect() const
{
    QRect rect = mCursorImage->image()->rect().translated(-mCursorImage->hotspot().x(),
                                                          -mCursorImage->hotspot().y());
    rect.translate(m_pos);
    QPoint mScreenOffset = mScreen->geometry().topLeft();
    rect.translate(-mScreenOffset);  // global to local translation
    return rect;
}